

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderCodeVariableDescX::SetDefaultTypeName
          (ShaderCodeVariableDescX *this,SHADER_SOURCE_LANGUAGE Language)

{
  SHADER_SOURCE_LANGUAGE in_stack_ffffffffffffffc8;
  string local_30;
  
  GetShaderCodeTypeName_abi_cxx11_
            (&local_30,(Diligent *)(ulong)(this->super_ShaderCodeVariableDesc).BasicType,
             (this->super_ShaderCodeVariableDesc).Class,(this->super_ShaderCodeVariableDesc).NumRows
             ,(uint)(this->super_ShaderCodeVariableDesc).NumColumns,Language,
             in_stack_ffffffffffffffc8);
  SetTypeName(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void SetDefaultTypeName(SHADER_SOURCE_LANGUAGE Language)
    {
        SetTypeName(GetShaderCodeTypeName(BasicType, Class, NumRows, NumColumns, Language));
    }